

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

int __thiscall
QFileDialog::accept(QFileDialog *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  QFileDialogPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  char cVar3;
  FileMode mode;
  AcceptMode AVar4;
  ulong uVar5;
  uint *__addr_len_00;
  Data *pDVar6;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr_00;
  sockaddr *extraout_RDX_02;
  sockaddr *psVar7;
  int iVar8;
  QFileDialogPrivate *pQVar10;
  QFileDialogPrivate *this_01;
  long lVar11;
  long in_FS_OFFSET;
  QFileInfo info;
  ulong local_b0;
  Data *local_a8;
  QFileInfo info_1;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QString> local_78;
  undefined1 local_58 [16];
  Data *local_48;
  long local_38;
  QArrayDataPointer<QString> *pQVar9;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if (((this_00->super_QDialogPrivate).nativeDialogInUse != false) ||
     ((this_00->qFileDialogUi).d == (Ui_QFileDialog *)0x0)) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    selectedUrls((QList<QUrl> *)&local_78,this);
    if ((undefined1 *)local_78.size != (undefined1 *)0x0) {
      pQVar9 = &local_78;
      QFileDialogPrivate::emitUrlsSelected(this_00,(QList<QUrl> *)pQVar9);
      iVar8 = (int)pQVar9;
      psVar7 = extraout_RDX;
      if ((undefined1 *)local_78.size == (undefined1 *)0x1) {
        pQVar10 = (QFileDialogPrivate *)local_78.ptr;
        QFileDialogPrivate::emitUrlSelected(this_00,(QUrl *)local_78.ptr);
        iVar8 = (int)pQVar10;
        psVar7 = extraout_RDX_00;
      }
      QDialog::accept(&this->super_QDialog,iVar8,psVar7,__addr_len);
    }
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_78);
    goto LAB_0049ef74;
  }
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  selectedFiles((QStringList *)&local_78,this);
  if ((undefined1 *)local_78.size == (undefined1 *)0x0) goto LAB_0049ef6a;
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QString *)&local_98,&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit)
  ;
  local_58._0_8_ = (QObject *)0x2;
  local_58._8_8_ = "..";
  bVar2 = ::operator==((QString *)&local_98,(QLatin1StringView *)local_58);
  if (bVar2) {
    QFileDialogPrivate::navigateToParent(this_00);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QSignalBlocker::QSignalBlocker
              ((QSignalBlocker *)local_58,(QObject *)((this_00->qFileDialogUi).d)->fileNameEdit);
    QLineEdit::selectAll(&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
    QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_58);
    goto switchD_0049eb89_default;
  }
  mode = fileMode(this);
  __addr_len_00 = &switchD_0049eb89::switchdataD_0066a634;
  switch(mode) {
  case AnyFile:
    local_58._0_8_ = *(undefined8 *)&((QDialogPrivate *)&(local_78.ptr)->d)->super_QWidgetPrivate;
    local_58._8_8_ =
         *(undefined8 *)&(((QDialogPrivate *)&(local_78.ptr)->d)->super_QWidgetPrivate).field_0x8;
    pDVar6 = *(Data **)&(((QDialogPrivate *)&(local_78.ptr)->d)->super_QWidgetPrivate).field_0x10;
    if ((QObject *)local_58._0_8_ != (QObject *)0x0) {
      LOCK();
      *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + 1;
      UNLOCK();
    }
    _info_1 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = pDVar6;
    QFileInfo::QFileInfo(&info_1,(QString *)local_58);
    cVar3 = QFileInfo::isDir();
    if (cVar3 == '\0') {
      cVar3 = QFileInfo::exists();
      if (cVar3 == '\0') {
        QFileInfo::path();
        uVar5 = QFileDialogPrivate::maxNameLength((QString *)&info);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
        if (-1 < (long)uVar5) {
          QFileInfo::fileName();
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
          if (uVar5 < local_b0) goto LAB_0049ef49;
        }
      }
      cVar3 = QFileInfo::exists();
      if (((cVar3 != '\0') && (bVar2 = testOption(this,DontConfirmOverwrite), !bVar2)) &&
         (AVar4 = acceptMode(this), AVar4 != AcceptOpen)) {
        QFileInfo::fileName();
        bVar2 = QFileDialogPrivate::itemAlreadyExists(this_00,(QString *)&info);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
        if (!bVar2) goto LAB_0049ef49;
      }
      QList<QString>::QList<QString,void>((QList<QString> *)&info,(QString *)local_58);
      pQVar9 = (QArrayDataPointer<QString> *)&info;
      QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)&info);
      iVar8 = (int)pQVar9;
      QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&info);
      psVar7 = extraout_RDX_02;
LAB_0049ef17:
      QDialog::accept(&this->super_QDialog,iVar8,psVar7,(socklen_t *)pDVar6);
    }
    else {
      QFileInfo::absoluteFilePath();
      setDirectory(this,(QString *)&info);
LAB_0049ef44:
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
    }
    goto LAB_0049ef49;
  case ExistingFile:
  case ExistingFiles:
    pQVar10 = (QFileDialogPrivate *)local_78.ptr;
    for (lVar11 = local_78.size * 0x18; lVar11 != 0; lVar11 = lVar11 + -0x18) {
      _info = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      this_01 = pQVar10;
      QFileInfo::QFileInfo(&info,(QString *)pQVar10);
      cVar3 = QFileInfo::exists();
      if (cVar3 == '\0') {
        QFileDialogPrivate::getEnvironmentVariable((QString *)local_58,this_01,(QString *)pQVar10);
        QFileInfo::QFileInfo(&info_1,(QString *)local_58);
        __addr_len_00 = (uint *)_info_1;
        pDVar6 = _info;
        _info = _info_1;
        _info_1 = pDVar6;
        QFileInfo::~QFileInfo(&info_1);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
      }
      cVar3 = QFileInfo::exists();
      if (cVar3 == '\0') {
        QFileInfo::fileName();
        QFileDialogPrivate::itemNotFound(this_00,(QString *)local_58,mode);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
LAB_0049ee2b:
        QFileInfo::~QFileInfo(&info);
        goto switchD_0049eb89_default;
      }
      cVar3 = QFileInfo::isDir();
      if (cVar3 != '\0') {
        QFileInfo::absoluteFilePath();
        setDirectory(this,(QString *)local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
        QLineEdit::clear(&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
        goto LAB_0049ee2b;
      }
      QFileInfo::~QFileInfo(&info);
      pQVar10 = (QFileDialogPrivate *)
                &(pQVar10->super_QDialogPrivate).super_QWidgetPrivate.field_0x18;
    }
    pQVar9 = &local_78;
    QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)pQVar9);
    QDialog::accept(&this->super_QDialog,(int)pQVar9,__addr_00,__addr_len_00);
    break;
  case Directory:
    local_58._0_8_ = *(undefined8 *)&((QDialogPrivate *)&(local_78.ptr)->d)->super_QWidgetPrivate;
    local_58._8_8_ =
         *(undefined8 *)&(((QDialogPrivate *)&(local_78.ptr)->d)->super_QWidgetPrivate).field_0x8;
    pDVar6 = *(Data **)&(((QDialogPrivate *)&(local_78.ptr)->d)->super_QWidgetPrivate).field_0x10;
    if ((QObject *)local_58._0_8_ != (QObject *)0x0) {
      LOCK();
      *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + 1;
      UNLOCK();
    }
    _info_1 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar10 = (QFileDialogPrivate *)local_58;
    local_48 = pDVar6;
    QFileInfo::QFileInfo(&info_1,(QString *)pQVar10);
    cVar3 = QFileInfo::exists();
    if (cVar3 == '\0') {
      QFileDialogPrivate::getEnvironmentVariable((QString *)&info,pQVar10,(QString *)local_58);
      QFileInfo::QFileInfo((QFileInfo *)&local_a8,(QString *)&info);
      pDVar1 = _info_1;
      pDVar6 = local_a8;
      _info_1 = local_a8;
      local_a8 = pDVar1;
      QFileInfo::~QFileInfo((QFileInfo *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&info);
    }
    cVar3 = QFileInfo::exists();
    if (cVar3 == '\0') {
      QFileInfo::fileName();
      QFileDialogPrivate::itemNotFound(this_00,(QString *)&info,Directory);
      goto LAB_0049ef44;
    }
    cVar3 = QFileInfo::isDir();
    if (cVar3 != '\0') {
      pQVar9 = &local_78;
      QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)pQVar9);
      iVar8 = (int)pQVar9;
      psVar7 = extraout_RDX_01;
      goto LAB_0049ef17;
    }
LAB_0049ef49:
    QFileInfo::~QFileInfo(&info_1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  }
switchD_0049eb89_default:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
LAB_0049ef6a:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
LAB_0049ef74:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QFileDialog::accept()
{
    Q_D(QFileDialog);
    if (!d->usingWidgets()) {
        const QList<QUrl> urls = selectedUrls();
        if (urls.isEmpty())
            return;
        d->emitUrlsSelected(urls);
        if (urls.size() == 1)
            d->emitUrlSelected(urls.first());
        QDialog::accept();
        return;
    }

    const QStringList files = selectedFiles();
    if (files.isEmpty())
        return;
    QString lineEditText = d->lineEdit()->text();
    // "hidden feature" type .. and then enter, and it will move up a dir
    // special case for ".."
    if (lineEditText == ".."_L1) {
        d->navigateToParent();
        const QSignalBlocker blocker(d->qFileDialogUi->fileNameEdit);
        d->lineEdit()->selectAll();
        return;
    }

    const auto mode = fileMode();
    switch (mode) {
    case Directory: {
        QString fn = files.first();
        QFileInfo info(fn);
        if (!info.exists())
            info = QFileInfo(d->getEnvironmentVariable(fn));
        if (!info.exists()) {
            d->itemNotFound(info.fileName(), mode);
            return;
        }
        if (info.isDir()) {
            d->emitFilesSelected(files);
            QDialog::accept();
        }
        return;
    }

    case AnyFile: {
        QString fn = files.first();
        QFileInfo info(fn);
        if (info.isDir()) {
            setDirectory(info.absoluteFilePath());
            return;
        }

        if (!info.exists()) {
            const long maxNameLength = d->maxNameLength(info.path());
            if (maxNameLength >= 0 && info.fileName().size() > maxNameLength)
                return;
        }

        // check if we have to ask for permission to overwrite the file
        if (!info.exists() || testOption(DontConfirmOverwrite) || acceptMode() == AcceptOpen) {
            d->emitFilesSelected(QStringList(fn));
            QDialog::accept();
        } else {
            if (d->itemAlreadyExists(info.fileName())) {
                d->emitFilesSelected(QStringList(fn));
                QDialog::accept();
            }
        }
        return;
    }

    case ExistingFile:
    case ExistingFiles:
        for (const auto &file : files) {
            QFileInfo info(file);
            if (!info.exists())
                info = QFileInfo(d->getEnvironmentVariable(file));
            if (!info.exists()) {
                d->itemNotFound(info.fileName(), mode);
                return;
            }
            if (info.isDir()) {
                setDirectory(info.absoluteFilePath());
                d->lineEdit()->clear();
                return;
            }
        }
        d->emitFilesSelected(files);
        QDialog::accept();
        return;
    }
}